

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O2

void ucm_addMapping(UCMTable *table,UCMapping *m,UChar32 *codePoints,uint8_t *bytes)

{
  char cVar1;
  uint32_t uVar2;
  UCMapping *pUVar3;
  int8_t iVar4;
  int8_t iVar5;
  int8_t iVar6;
  anon_union_4_2_095b93d3_for_b aVar7;
  int iVar8;
  UCMapping *pUVar9;
  UChar32 *pUVar10;
  uint8_t *puVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  size_t sStack_30;
  
  iVar8 = table->mappingsCapacity;
  if (iVar8 <= table->mappingsLength) {
    iVar14 = 1000;
    if (iVar8 != 0) {
      iVar14 = iVar8 * 10;
    }
    table->mappingsCapacity = iVar14;
    pUVar9 = (UCMapping *)uprv_realloc_63(table->mappings,(long)iVar14 * 0xc);
    table->mappings = pUVar9;
    if (pUVar9 != (UCMapping *)0x0) {
      if (table->reverseMap != (int32_t *)0x0) {
        uprv_free_63(table->reverseMap);
        table->reverseMap = (int32_t *)0x0;
      }
      goto LAB_001e94f8;
    }
    uVar15 = (ulong)(uint)table->mappingsCapacity;
    pcVar16 = "ucm error: unable to allocate %d UCMappings\n";
LAB_001e969e:
    fprintf(_stderr,pcVar16,uVar15);
    goto LAB_001e96a5;
  }
LAB_001e94f8:
  if (('\x01' < m->uLen) && (table->codePointsCapacity == 0)) {
    table->codePointsCapacity = 10000;
    pUVar10 = (UChar32 *)uprv_malloc_63(40000);
    table->codePoints = pUVar10;
    if (pUVar10 == (UChar32 *)0x0) {
      uVar15 = (ulong)(uint)table->codePointsCapacity;
      pcVar16 = "ucm error: unable to allocate %d UChar32s\n";
      goto LAB_001e969e;
    }
  }
  if (('\x04' < m->bLen) && (table->bytesCapacity == 0)) {
    table->bytesCapacity = 10000;
    puVar11 = (uint8_t *)uprv_malloc_63(10000);
    table->bytes = puVar11;
    if (puVar11 == (uint8_t *)0x0) {
      uVar15 = (ulong)(uint)table->bytesCapacity;
      pcVar16 = "ucm error: unable to allocate %d bytes\n";
      goto LAB_001e969e;
    }
  }
  bVar13 = m->uLen;
  if ((char)bVar13 < 2) {
LAB_001e958a:
    iVar8 = (int)m->bLen;
    if (iVar8 < 5) {
LAB_001e95bf:
      cVar1 = m->uLen;
      for (lVar12 = 0; lVar12 < cVar1; lVar12 = lVar12 + 1) {
        bVar13 = 1;
        if ((0xffff < codePoints[lVar12]) ||
           (bVar13 = 2, (codePoints[lVar12] & 0xfffff800U) == 0xd800)) {
          table->unicodeMask = table->unicodeMask | bVar13;
        }
      }
      table->flagsType = table->flagsType | 1U - (m->f >> 7);
      pUVar9 = table->mappings;
      iVar8 = table->mappingsLength;
      table->mappingsLength = iVar8 + 1;
      iVar4 = m->bLen;
      iVar5 = m->f;
      iVar6 = m->moveFlag;
      pUVar3 = pUVar9 + iVar8;
      pUVar3->uLen = m->uLen;
      pUVar3->bLen = iVar4;
      pUVar3->f = iVar5;
      pUVar3->moveFlag = iVar6;
      aVar7 = m->b;
      pUVar9 = pUVar9 + iVar8;
      pUVar9->u = m->u;
      pUVar9->b = aVar7;
      table->isSorted = '\0';
      return;
    }
    uVar2 = table->bytesLength;
    table->bytesLength = uVar2 + iVar8;
    if ((int)(uVar2 + iVar8) <= table->bytesCapacity) {
      memcpy(table->bytes + (int)uVar2,bytes,(long)iVar8);
      (m->b).idx = uVar2;
      goto LAB_001e95bf;
    }
    pcVar16 = "ucm error: too many bytes in mappings with >4 charset bytes\n";
    sStack_30 = 0x3c;
  }
  else {
    iVar8 = table->codePointsLength;
    iVar14 = iVar8 + (char)bVar13;
    table->codePointsLength = iVar14;
    if (iVar14 <= table->codePointsCapacity) {
      memcpy(table->codePoints + iVar8,codePoints,(ulong)bVar13 << 2);
      m->u = iVar8;
      goto LAB_001e958a;
    }
    pcVar16 = "ucm error: too many code points in multiple-code point mappings\n";
    sStack_30 = 0x40;
  }
  fwrite(pcVar16,sStack_30,1,_stderr);
LAB_001e96a5:
  exit(7);
}

Assistant:

U_CAPI void U_EXPORT2
ucm_addMapping(UCMTable *table,
               UCMapping *m,
               UChar32 codePoints[UCNV_EXT_MAX_UCHARS],
               uint8_t bytes[UCNV_EXT_MAX_BYTES]) {
    UCMapping *tm;
    UChar32 c;
    int32_t idx;

    if(table->mappingsLength>=table->mappingsCapacity) {
        /* make the mappings array larger */
        if(table->mappingsCapacity==0) {
            table->mappingsCapacity=1000;
        } else {
            table->mappingsCapacity*=10;
        }
        table->mappings=(UCMapping *)uprv_realloc(table->mappings,
                                             table->mappingsCapacity*sizeof(UCMapping));
        if(table->mappings==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d UCMappings\n",
                            (int)table->mappingsCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        if(table->reverseMap!=NULL) {
            /* the reverseMap must be reallocated in a new sort */
            uprv_free(table->reverseMap);
            table->reverseMap=NULL;
        }
    }

    if(m->uLen>1 && table->codePointsCapacity==0) {
        table->codePointsCapacity=10000;
        table->codePoints=(UChar32 *)uprv_malloc(table->codePointsCapacity*4);
        if(table->codePoints==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d UChar32s\n",
                            (int)table->codePointsCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
    }

    if(m->bLen>4 && table->bytesCapacity==0) {
        table->bytesCapacity=10000;
        table->bytes=(uint8_t *)uprv_malloc(table->bytesCapacity);
        if(table->bytes==NULL) {
            fprintf(stderr, "ucm error: unable to allocate %d bytes\n",
                            (int)table->bytesCapacity);
            exit(U_MEMORY_ALLOCATION_ERROR);
        }
    }

    if(m->uLen>1) {
        idx=table->codePointsLength;
        table->codePointsLength+=m->uLen;
        if(table->codePointsLength>table->codePointsCapacity) {
            fprintf(stderr, "ucm error: too many code points in multiple-code point mappings\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        uprv_memcpy(table->codePoints+idx, codePoints, (size_t)m->uLen*4);
        m->u=idx;
    }

    if(m->bLen>4) {
        idx=table->bytesLength;
        table->bytesLength+=m->bLen;
        if(table->bytesLength>table->bytesCapacity) {
            fprintf(stderr, "ucm error: too many bytes in mappings with >4 charset bytes\n");
            exit(U_MEMORY_ALLOCATION_ERROR);
        }

        uprv_memcpy(table->bytes+idx, bytes, m->bLen);
        m->b.idx=idx;
    }

    /* set unicodeMask */
    for(idx=0; idx<m->uLen; ++idx) {
        c=codePoints[idx];
        if(c>=0x10000) {
            table->unicodeMask|=UCNV_HAS_SUPPLEMENTARY; /* there are supplementary code points */
        } else if(U_IS_SURROGATE(c)) {
            table->unicodeMask|=UCNV_HAS_SURROGATES;    /* there are surrogate code points */
        }
    }

    /* set flagsType */
    if(m->f<0) {
        table->flagsType|=UCM_FLAGS_IMPLICIT;
    } else {
        table->flagsType|=UCM_FLAGS_EXPLICIT;
    }

    tm=table->mappings+table->mappingsLength++;
    uprv_memcpy(tm, m, sizeof(UCMapping));

    table->isSorted=FALSE;
}